

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O0

void __thiscall Sampling_Normal_Test::TestBody(Sampling_Normal_Test *this)

{
  Allocator alloc;
  bool bVar1;
  int iVar2;
  Float FVar3;
  float fVar4;
  Float FVar5;
  AssertionResult gtest_ar_;
  anon_class_1_0_00000001 checkErr;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Float dx;
  Float dp;
  Float cp;
  Float cx;
  Float u;
  Uniform1DIter __end2;
  Uniform1DIter __begin2;
  Uniform1D *__range2;
  PiecewiseConstant1D distrib;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> values;
  anon_class_16_2_ab2c689a normal;
  Float sigma;
  Float mu;
  Float *p;
  Float (*__end1) [2];
  Float (*__begin1) [2];
  Float (*__range1) [4] [2];
  Float params [4] [2];
  undefined4 in_stack_fffffffffffffcc8;
  Float in_stack_fffffffffffffccc;
  PiecewiseConstant1D *in_stack_fffffffffffffcd0;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_stack_fffffffffffffcd8;
  function<float_(float)> *in_stack_fffffffffffffce0;
  Message *in_stack_fffffffffffffce8;
  Message *in_stack_fffffffffffffcf0;
  Float in_stack_fffffffffffffcfc;
  AssertHelper *in_stack_fffffffffffffd00;
  Message *in_stack_fffffffffffffd08;
  Message *in_stack_fffffffffffffd10;
  Message *in_stack_fffffffffffffd18;
  PiecewiseConstant1D *in_stack_fffffffffffffd20;
  char *in_stack_fffffffffffffd38;
  Message *in_stack_fffffffffffffd40;
  AssertionResult *in_stack_fffffffffffffd48;
  AssertHelper *in_stack_fffffffffffffd50;
  Message *in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd60;
  float in_stack_fffffffffffffd64;
  Allocator in_stack_fffffffffffffd68;
  Message *in_stack_fffffffffffffd80;
  Message *in_stack_fffffffffffffd88;
  undefined7 in_stack_fffffffffffffd90;
  undefined1 in_stack_fffffffffffffd97;
  string local_238 [24];
  Float in_stack_fffffffffffffde0;
  Float in_stack_fffffffffffffde4;
  PiecewiseConstant1D *in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  Float in_stack_fffffffffffffdf4;
  span<const_float> in_stack_fffffffffffffdf8;
  AssertionResult local_1c8 [2];
  undefined8 local_1a8;
  float local_19c;
  AssertionResult local_198;
  Float local_184;
  float local_180;
  Float local_17c;
  Float local_178;
  Float local_174;
  IndexingIterator<pbrt::detail::Uniform1DIter> local_158 [3];
  undefined1 local_140 [24];
  undefined1 *local_128;
  undefined1 local_108 [168];
  uint *local_60;
  uint *local_58;
  uint local_50;
  uint local_4c;
  uint *local_48;
  uint *local_40;
  uint *local_38;
  uint *local_30;
  uint local_28 [10];
  
  local_28[0] = 0;
  local_28[1] = 0x3f800000;
  local_28[2] = 0xbf000000;
  local_28[3] = 0x3f4ccccd;
  local_28[4] = 0x3e800000;
  local_28[5] = 0x3ba3d70a;
  local_28[6] = 0x40666666;
  local_28[7] = 0x3fcccccd;
  local_40 = local_28 + 8;
  local_38 = local_28;
  local_30 = local_38;
  for (; local_38 != local_40; local_38 = local_38 + 2) {
    local_48 = local_38;
    local_4c = *local_38;
    local_50 = local_38[1];
    local_60 = &local_50;
    local_58 = &local_4c;
    std::function<float(float)>::function<Sampling_Normal_Test::TestBody()::__0&,void>
              (in_stack_fffffffffffffce0,(anon_class_16_2_ab2c689a *)in_stack_fffffffffffffcd8);
    vfmadd213ss_fma(SUB6416(ZEXT464(0xc0e00000),0),ZEXT416(local_50),ZEXT416(local_4c));
    vfmadd213ss_fma(SUB6416(ZEXT464(0x40e00000),0),ZEXT416(local_50),ZEXT416(local_4c));
    pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
              ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffcd0);
    pbrt::Sample1DFunction
              ((function<float_(float)> *)
               CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
               (int)((ulong)in_stack_fffffffffffffd58 >> 0x20),(int)in_stack_fffffffffffffd58,
               (Float)((ulong)in_stack_fffffffffffffd50 >> 0x20),SUB84(in_stack_fffffffffffffd50,0),
               in_stack_fffffffffffffd68);
    std::function<float_(float)>::~function((function<float_(float)> *)0x643010);
    pstd::span<float_const>::
    span<pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>,void,pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>>
              ((span<const_float> *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
    vfmadd213ss_fma(SUB6416(ZEXT464(0xc0e00000),0),ZEXT416(local_50),ZEXT416(local_4c));
    vfmadd213ss_fma(SUB6416(ZEXT464(0x40e00000),0),ZEXT416(local_50),ZEXT416(local_4c));
    pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
              ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffcd0);
    alloc.memoryResource._4_4_ = in_stack_fffffffffffffdf4;
    alloc.memoryResource._0_4_ = in_stack_fffffffffffffdf0;
    pbrt::PiecewiseConstant1D::PiecewiseConstant1D
              (in_stack_fffffffffffffde8,in_stack_fffffffffffffdf8,in_stack_fffffffffffffde4,
               in_stack_fffffffffffffde0,alloc);
    pbrt::Uniform1D::RNGGenerator
              ((Uniform1D *)in_stack_fffffffffffffce0,
               (int)((ulong)in_stack_fffffffffffffcd8 >> 0x20),(uint64_t)in_stack_fffffffffffffcd0,
               CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    local_128 = local_140;
    pbrt::detail::IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter>::begin
              ((IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter> *)
               in_stack_fffffffffffffcd0);
    pbrt::detail::IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter>::end
              ((IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter> *)
               in_stack_fffffffffffffcd0);
    while (bVar1 = pbrt::detail::IndexingIterator<pbrt::detail::Uniform1DIter>::operator!=
                             ((IndexingIterator<pbrt::detail::Uniform1DIter> *)
                              in_stack_fffffffffffffcd0,
                              (Uniform1DIter *)
                              CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8)), bVar1)
    {
      local_174 = pbrt::detail::Uniform1DIter::operator*((Uniform1DIter *)0x643146);
      local_178 = pbrt::SampleNormal((Float)((ulong)in_stack_fffffffffffffcd0 >> 0x20),
                                     SUB84(in_stack_fffffffffffffcd0,0),in_stack_fffffffffffffccc);
      local_17c = pbrt::NormalPDF((Float)((ulong)in_stack_fffffffffffffcd0 >> 0x20),
                                  SUB84(in_stack_fffffffffffffcd0,0),in_stack_fffffffffffffccc);
      iVar2 = (int)local_108;
      FVar3 = pbrt::PiecewiseConstant1D::Sample
                        (in_stack_fffffffffffffd20,(Float)((ulong)in_stack_fffffffffffffd18 >> 0x20)
                         ,(Float *)in_stack_fffffffffffffd10,(int *)in_stack_fffffffffffffd08);
      fVar4 = local_178 - FVar3;
      local_184 = FVar3;
      std::abs(iVar2);
      local_1a8 = 0x3f689374bc6a7efa;
      local_19c = fVar4;
      testing::internal::CmpHelperLT<float,double>
                ((char *)CONCAT44(FVar3,fVar4),
                 (char *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                 (float *)in_stack_fffffffffffffd88,(double *)in_stack_fffffffffffffd80);
      in_stack_fffffffffffffd97 = testing::AssertionResult::operator_cast_to_bool(&local_198);
      if (!(bool)in_stack_fffffffffffffd97) {
        testing::Message::Message((Message *)in_stack_fffffffffffffd00);
        in_stack_fffffffffffffd88 =
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffcd0,
                        (char (*) [15])CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8)
                       );
        in_stack_fffffffffffffd80 =
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffcd0,
                        (float *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
        testing::Message::operator<<
                  ((Message *)in_stack_fffffffffffffcd0,
                   (char (*) [13])CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
        testing::Message::operator<<
                  ((Message *)in_stack_fffffffffffffcd0,
                   (float *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
        in_stack_fffffffffffffd68.memoryResource =
             (memory_resource *)
             testing::AssertionResult::failure_message((AssertionResult *)0x6433c2);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffd00,(Type)in_stack_fffffffffffffcfc,
                   (char *)in_stack_fffffffffffffcf0,(int)((ulong)in_stack_fffffffffffffce8 >> 0x20)
                   ,(char *)in_stack_fffffffffffffce0);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffd50,(Message *)in_stack_fffffffffffffd48);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffcd0);
        testing::Message::~Message((Message *)0x643425);
      }
      iVar2 = (int)&local_198;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x64347d);
      in_stack_fffffffffffffd64 = local_17c - local_180;
      std::abs(iVar2);
      testing::internal::CmpHelperLT<float,double>
                ((char *)CONCAT44(FVar3,fVar4),
                 (char *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                 (float *)in_stack_fffffffffffffd88,(double *)in_stack_fffffffffffffd80);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1c8);
      in_stack_fffffffffffffd60 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd60);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffd00);
        in_stack_fffffffffffffd58 =
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffcd0,
                        (char (*) [19])CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8)
                       );
        in_stack_fffffffffffffd50 =
             (AssertHelper *)
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffcd0,
                        (float *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
        in_stack_fffffffffffffd48 =
             (AssertionResult *)
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffcd0,
                        (char (*) [17])CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8)
                       );
        in_stack_fffffffffffffd40 =
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffcd0,
                        (float *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
        in_stack_fffffffffffffd38 =
             testing::AssertionResult::failure_message((AssertionResult *)0x6435e7);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffd00,(Type)in_stack_fffffffffffffcfc,
                   (char *)in_stack_fffffffffffffcf0,(int)((ulong)in_stack_fffffffffffffce8 >> 0x20)
                   ,(char *)in_stack_fffffffffffffce0);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffd50,(Message *)in_stack_fffffffffffffd48);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffcd0);
        testing::Message::~Message((Message *)0x643641);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x643699);
      FVar3 = local_174;
      FVar5 = pbrt::InvertNormalSample
                        ((Float)((ulong)in_stack_fffffffffffffcd0 >> 0x20),
                         SUB84(in_stack_fffffffffffffcd0,0),in_stack_fffffffffffffccc);
      TestBody::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)in_stack_fffffffffffffce0,
                 (Float)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
                 SUB84(in_stack_fffffffffffffcd8,0));
      testing::AssertionResult::AssertionResult
                ((AssertionResult *)in_stack_fffffffffffffcd0,
                 SUB41((uint)in_stack_fffffffffffffccc >> 0x18,0));
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffffe00);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffd00);
        in_stack_fffffffffffffd20 =
             (PiecewiseConstant1D *)
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffcd0,
                        (char (*) [4])CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8))
        ;
        in_stack_fffffffffffffd18 =
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffcd0,
                        (float *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
        in_stack_fffffffffffffd10 =
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffcd0,
                        (char (*) [9])CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8))
        ;
        in_stack_fffffffffffffd08 =
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffcd0,
                        (float *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
        in_stack_fffffffffffffd00 =
             (AssertHelper *)
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffcd0,
                        (char (*) [5])CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8))
        ;
        in_stack_fffffffffffffcfc =
             pbrt::InvertNormalSample
                       ((Float)((ulong)in_stack_fffffffffffffcd0 >> 0x20),
                        SUB84(in_stack_fffffffffffffcd0,0),in_stack_fffffffffffffccc);
        in_stack_fffffffffffffdf4 = in_stack_fffffffffffffcfc;
        in_stack_fffffffffffffcf0 =
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffcd0,
                        (float *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
        in_stack_fffffffffffffce8 =
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffcd0,
                        (char (*) [10])CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8)
                       );
        in_stack_fffffffffffffce0 =
             (function<float_(float)> *)
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffcd0,
                        (float *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
        in_stack_fffffffffffffcd8 =
             (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffcd0,
                        (char (*) [12])CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8)
                       );
        in_stack_fffffffffffffcd0 =
             (PiecewiseConstant1D *)
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffcd0,
                        (float *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (in_stack_fffffffffffffd48,(char *)in_stack_fffffffffffffd40,
                   in_stack_fffffffffffffd38,(char *)CONCAT44(FVar5,FVar3));
        std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffd00,(Type)in_stack_fffffffffffffcfc,
                   (char *)in_stack_fffffffffffffcf0,(int)((ulong)in_stack_fffffffffffffce8 >> 0x20)
                   ,(char *)in_stack_fffffffffffffce0);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffd50,(Message *)in_stack_fffffffffffffd48);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffcd0);
        std::__cxx11::string::~string(local_238);
        testing::Message::~Message((Message *)0x64392c);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x6439a4);
      pbrt::detail::IndexingIterator<pbrt::detail::Uniform1DIter>::operator++(local_158);
    }
    pbrt::PiecewiseConstant1D::~PiecewiseConstant1D(in_stack_fffffffffffffcd0);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
              (&in_stack_fffffffffffffcd0->func);
  }
  return;
}

Assistant:

TEST(Sampling, Normal) {
    Float params[][2] = {{0., 1.}, {-.5, .8}, {.25, .005}, {3.6, 1.6}};
    for (const auto p : params) {
        Float mu = p[0], sigma = p[1];
        auto normal = [&](Float x) {
            return 1 / std::sqrt(2 * Pi * sigma * sigma) *
                   std::exp(-Sqr(x - mu) / (2 * sigma * sigma));
        };
        auto values = Sample1DFunction(normal, 8192, 16, mu - 7 * sigma, mu + 7 * sigma);
        PiecewiseConstant1D distrib(values, mu - 7 * sigma, mu + 7 * sigma);

        for (Float u : Uniform1D(100)) {
            Float cx = SampleNormal(u, mu, sigma);
            Float cp = NormalPDF(cx, mu, sigma);

            Float dp;
            Float dx = distrib.Sample(u, &dp);
            EXPECT_LT(std::abs(cx - dx), 3e-3)
                << "Closed form = " << cx << ", distrib = " << dx;
            EXPECT_LT(std::abs(cp - dp) / dp, .025)
                << "Closed form PDF = " << cp << ", distrib PDF = " << dp;

            auto checkErr = [](Float a, Float b) {
                Float err;
                if (std::min(std::abs(a), std::abs(b)) < 1e-2)
                    err = std::abs(a - b);
                else
                    err = std::abs(2 * (a - b) / (a + b));
                return err > 1e-2;
            };
            EXPECT_FALSE(checkErr(u, InvertNormalSample(cx, mu, sigma)))
                << " u " << u << " -> x = " << cx << " -> "
                << InvertNormalSample(cx, mu, sigma) << " with mu " << mu << " and sigma "
                << sigma;
        }
    }
}